

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O3

string * duckdb::FormatOptionLine<unsigned_long>
                   (string *__return_storage_ptr__,string *name,CSVOption<unsigned_long> *option)

{
  undefined8 *puVar1;
  pointer pcVar2;
  long lVar3;
  undefined8 *puVar4;
  long *plVar5;
  ulong *puVar6;
  size_type *psVar7;
  ulong uVar8;
  undefined8 uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined8 *local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 *local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  ulong *local_a0;
  long local_98;
  ulong local_90;
  long lStack_88;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  string local_60;
  string local_40;
  
  pcVar2 = (name->_M_dataplus)._M_p;
  local_80 = local_70;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar2,pcVar2 + name->_M_string_length);
  ::std::__cxx11::string::append((char *)&local_80);
  CSVOption<unsigned_long>::FormatValueInternal_abi_cxx11_(&local_40,option,&option->value);
  uVar8 = 0xf;
  if (local_80 != local_70) {
    uVar8 = local_70[0];
  }
  if (uVar8 < local_40._M_string_length + local_78) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      uVar9 = local_40.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_40._M_string_length + local_78) goto LAB_0152ddb0;
    puVar4 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,(ulong)local_80);
  }
  else {
LAB_0152ddb0:
    puVar4 = (undefined8 *)
             ::std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_40._M_dataplus._M_p);
  }
  local_e0 = &local_d0;
  puVar1 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar1) {
    local_d0 = *puVar1;
    uStack_c8 = puVar4[3];
  }
  else {
    local_d0 = *puVar1;
    local_e0 = (undefined8 *)*puVar4;
  }
  local_d8 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)::std::__cxx11::string::append((char *)&local_e0);
  puVar6 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar6) {
    local_90 = *puVar6;
    lStack_88 = plVar5[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *puVar6;
    local_a0 = (ulong *)*plVar5;
  }
  local_98 = plVar5[1];
  *plVar5 = (long)puVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  CSVOption<unsigned_long>::FormatSet_abi_cxx11_(&local_60,option);
  uVar8 = 0xf;
  if (local_a0 != &local_90) {
    uVar8 = local_90;
  }
  if (uVar8 < local_60._M_string_length + local_98) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      uVar9 = local_60.field_2._M_allocated_capacity;
    }
    if (local_60._M_string_length + local_98 <= (ulong)uVar9) {
      puVar4 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_a0);
      goto LAB_0152dee9;
    }
  }
  puVar4 = (undefined8 *)
           ::std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_60._M_dataplus._M_p);
LAB_0152dee9:
  local_c0 = &local_b0;
  puVar1 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar1) {
    local_b0 = *puVar1;
    uStack_a8 = puVar4[3];
  }
  else {
    local_b0 = *puVar1;
    local_c0 = (undefined8 *)*puVar4;
  }
  local_b8 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)::std::__cxx11::string::append((char *)&local_c0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar7) {
    lVar3 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_c0 != &local_b0) {
    operator_delete(local_c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

string FormatOptionLine(const string &name, const CSVOption<T> &option) {
	return name + " = " + option.FormatValue() + " " + option.FormatSet() + "\n  ";
}